

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge(Nwk_Grf_t *p,Nwk_Vrt_t *pVert)

{
  Nwk_Vrt_t *pNVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)pVert->nEdges;
  if (pVert->nEdges < 1) {
    uVar2 = uVar3;
  }
  pNVar1 = (Nwk_Vrt_t *)0x0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((pNVar1 == (Nwk_Vrt_t *)0x0) || (p->pVerts[(&pVert[1].Id)[uVar3]]->nEdges < pNVar1->nEdges))
    {
      pNVar1 = p->pVerts[(&pVert[1].Id)[uVar3]];
    }
  }
  return pNVar1;
}

Assistant:

Nwk_Vrt_t * Nwk_ManGraphListFindMinEdge( Nwk_Grf_t * p, Nwk_Vrt_t * pVert )
{
    Nwk_Vrt_t * pThis, * pMinCost = NULL;
    int k;
    Nwk_VertexForEachAdjacent( p, pVert, pThis, k )
    {
        if ( pMinCost == NULL || pMinCost->nEdges > pThis->nEdges )
            pMinCost = pThis;
    }
    return pMinCost;
}